

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
emplaceRealloc<slang::ast::ForeachLoopStatement::LoopDim>
          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this,pointer pos,
          LoopDim *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pLVar4;
  long lVar5;
  pointer pLVar6;
  pointer pLVar7;
  iterator __result;
  _Storage<slang::ConstantRange,_true> *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  LoopDim *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *)0x9ededb);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pLVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)pLVar4;
  pLVar6 = (pointer)operator_new(0x9edf3d);
  pLVar7 = pLVar6 + lVar5 / 0x18;
  (pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._M_payload = *in_RDX;
  *(_Storage<slang::ConstantRange,_true> *)
   &(pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ConstantRange>._M_engaged = in_RDX[1];
  pLVar7->loopVar = (IteratorSymbol *)in_RDX[2];
  pLVar4 = end(in_RDI);
  if (in_RSI == pLVar4) {
    __result = begin(in_RDI);
    pLVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::ForeachLoopStatement::LoopDim*,slang::ast::ForeachLoopStatement::LoopDim*>
              (in_RSI,__last,__result);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<slang::ast::ForeachLoopStatement::LoopDim*,slang::ast::ForeachLoopStatement::LoopDim*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pLVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::ForeachLoopStatement::LoopDim*,slang::ast::ForeachLoopStatement::LoopDim*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pLVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pLVar6;
  return pLVar7;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}